

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O2

void __thiscall reader_url_suite::test_path_abempty_one::test_method(test_path_abempty_one *this)

{
  bool bVar1;
  uint local_318;
  value local_314;
  view_type local_310;
  undefined8 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  url reader;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char input [26];
  
  local_310.ptr_ = input;
  builtin_strncpy(input + 0x10,".com/path",10);
  builtin_strncpy(input,"scheme://example",0x10);
  local_310.len_ = strlen(local_310.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_310);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x79);
  local_310.len_ = local_310.len_ & 0xffffffffffffff00;
  local_310.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_80 = "";
  local_314 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_318 = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_310,&local_88,0x79,2,2,&local_314,"reader.subcode()",&local_318,
             "url::token::subcode::scheme");
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x7a);
  local_310.len_ = local_310.len_ & 0xffffffffffffff00;
  local_310.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = "";
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_b0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[7]>
            (&local_310,&local_b8,0x7a,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"scheme","\"scheme\"");
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0x7b);
  local_310.len_ = local_310.len_ & 0xffffffffffffff00;
  local_310.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = "";
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2b8 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_314 = CONCAT31(local_314._1_3_,bVar1);
  local_318 = CONCAT31(local_318._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_310,&local_2c0,0x7b,2,2,&local_314,"reader.next()",&local_318,"true");
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x7c);
  local_310.len_ = local_310.len_ & 0xffffffffffffff00;
  local_310.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_100 = "";
  local_314 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_318 = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_310,&local_108,0x7c,2,2,&local_314,"reader.subcode()",&local_318,
             "url::token::subcode::authority_host_name");
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x7d);
  local_310.len_ = local_310.len_ & 0xffffffffffffff00;
  local_310.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_130 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[12]>
            (&local_310,&local_138,0x7d,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"example.com","\"example.com\"");
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x7e);
  local_310.len_ = local_310.len_ & 0xffffffffffffff00;
  local_310.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = "";
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2c8 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_314 = CONCAT31(local_314._1_3_,bVar1);
  local_318 = CONCAT31(local_318._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_310,&local_2d0,0x7e,2,2,&local_314,"reader.next()",&local_318,"true");
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x7f);
  local_310.len_ = local_310.len_ & 0xffffffffffffff00;
  local_310.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = "";
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2d8 = "";
  local_314 = trial::url::token::category
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_318 = 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::category::value,trial::url::token::category::value>
            (&local_310,&local_2e0,0x7f,2,2,&local_314,"reader.category()",&local_318,
             "url::token::category::path");
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x80);
  local_310.len_ = local_310.len_ & 0xffffffffffffff00;
  local_310.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = "";
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1a0 = "";
  local_314 = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_318 = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_310,&local_1a8,0x80,2,2,&local_314,"reader.code()",&local_318,
             "url::token::code::path_segment");
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x81);
  local_310.len_ = local_310.len_ & 0xffffffffffffff00;
  local_310.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = "";
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  local_314 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_318 = 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_310,&local_1d8,0x81,2,2,&local_314,"reader.subcode()",&local_318,
             "url::token::subcode::path_segment");
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0x82);
  local_310.len_ = local_310.len_ & 0xffffffffffffff00;
  local_310.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = "";
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_200 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[5]>
            (&local_310,&local_208,0x82,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"path","\"path\"");
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_210 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x83);
  local_310.len_ = local_310.len_ & 0xffffffffffffff00;
  local_310.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = "";
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_314 = CONCAT31(local_314._1_3_,bVar1);
  local_318 = local_318 & 0xffffff00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_310,&local_2f0,0x83,2,2,&local_314,"reader.next()",&local_318,"false");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_abempty_one)
{
    const char input[] = "scheme://example.com/path";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_name);
    BOOST_REQUIRE_EQUAL(reader.literal(), "example.com");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}